

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O3

AST * parse_additive_expression(Translation_Data *translation_data,Scope *scope)

{
  int iVar1;
  AST_Binary_Expression *left;
  AST *right;
  AST_Type type;
  
  left = (AST_Binary_Expression *)parse_multiplicative_expression(translation_data,scope);
  do {
    if (translation_data->tokens->size == 0) {
      return (AST *)left;
    }
    iVar1 = *translation_data->tokens->first->data;
    type = OP_ADDITION;
    if (iVar1 != 0x29) {
      if (iVar1 != 0x2b) {
        return (AST *)left;
      }
      type = OP_SUBTRACTION;
    }
    chomp(translation_data);
    right = parse_multiplicative_expression(translation_data,scope);
    left = get_binary_expression_tree((AST *)left,right,type);
  } while( true );
}

Assistant:

struct AST* parse_additive_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	
	struct AST *hold;
	hold=parse_multiplicative_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_PLUS:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_multiplicative_expression(translation_data,scope),OP_ADDITION);
				break;
			case KW_MINUS:
				chomp(translation_data);
				hold=(struct AST*)get_binary_expression_tree(hold,parse_multiplicative_expression(translation_data,scope),OP_SUBTRACTION);
				break;
			default:
				return hold;
		}
	}

	return hold;
}